

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpmOld.c
# Opt level: O2

Gia_Man_t * Gia_ManDupFf2In(Gia_Man_t *p,int nFlopsOld)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int v;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar2 = p->nRegs, iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - iVar2) + iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar2 = p->nRegs;
      break;
    }
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar1;
  }
  iVar5 = p->vCis->nSize;
  for (v = (iVar5 - iVar2) - nFlopsOld; v < iVar5 - iVar2; v = v + 1) {
    uVar1 = Gia_ManAppendCi(p_00);
    if (p->vCis->nSize - p->nRegs <= v) {
      __assert_fail("v < Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a6,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
    }
    pGVar4 = Gia_ManCi(p,v);
    pGVar4->Value = uVar1;
    iVar5 = p->vCis->nSize;
    iVar2 = p->nRegs;
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize - iVar2; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ManDupFf2In_rec(p_00,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
    iVar2 = p->nRegs;
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize - p->nRegs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    Gia_ManAppendCo(p_00,iVar2);
  }
  Gia_ManSetRegNum(p_00,nFlopsOld);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFf2In( Gia_Man_t * p, int nFlopsOld )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nFlopsOld; i < Gia_ManPiNum(p); i++ )
        Gia_ManPi(p, i)->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManDupFf2In_rec( pNew, Gia_ObjFanin0(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, nFlopsOld );
    return pNew;
}